

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O0

void mxx::allgatherv<int>
               (int *data,size_t size,int *out,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes,comm *comm)

{
  pointer *this;
  uint uVar1;
  int iVar2;
  const_iterator cVar3;
  size_type_conflict sVar4;
  const_iterator __last;
  iterator __result;
  MPI_Datatype poVar5;
  reference pvVar6;
  reference pvVar7;
  MPI_Datatype poVar8;
  MPI_Comm poVar9;
  undefined1 local_e0 [8];
  vector<int,_std::allocator<int>_> displs;
  allocator<int> local_a1;
  undefined1 local_a0 [8];
  vector<int,_std::allocator<int>_> counts;
  datatype dt;
  undefined1 local_60 [8];
  datatype mpi_sizet;
  size_t total_size;
  comm *comm_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes_local;
  int *out_local;
  size_t size_local;
  int *data_local;
  
  cVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(recv_sizes);
  mpi_sizet._16_8_ = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(recv_sizes);
  uVar1 = std::
          accumulate<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,int>
                    ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )cVar3._M_current,
                     (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )mpi_sizet._16_8_,0);
  sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(recv_sizes);
  iVar2 = mxx::comm::size(comm);
  if (sVar4 != (long)iVar2) {
    assert_fail("recv_sizes.size() == static_cast<size_t>(comm.size())",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/collective.hpp"
                ,0x3e3,"allgatherv");
  }
  get_datatype<unsigned_long>();
  if (uVar1 < 0x7fffffff) {
    get_datatype<int>();
    iVar2 = mxx::comm::size(comm);
    std::allocator<int>::allocator(&local_a1);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_a0,(long)iVar2,&local_a1);
    std::allocator<int>::~allocator(&local_a1);
    cVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(recv_sizes);
    __last = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(recv_sizes);
    __result = std::vector<int,_std::allocator<int>_>::begin
                         ((vector<int,_std::allocator<int>_> *)local_a0);
    displs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)std::
                  copy<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                            ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              )cVar3._M_current,
                             (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              )__last._M_current,
                             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                             __result._M_current);
    impl::get_displacements<int>
              ((vector<int,_std::allocator<int>_> *)local_e0,
               (vector<int,_std::allocator<int>_> *)local_a0);
    this = &counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage;
    poVar5 = datatype::type((datatype *)this);
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_a0,0);
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_e0,0);
    poVar8 = datatype::type((datatype *)this);
    poVar9 = mxx::comm::operator_cast_to_ompi_communicator_t_(comm);
    MPI_Allgatherv(data,size & 0xffffffff,poVar5,out,pvVar6,pvVar7,poVar8,poVar9);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_e0);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_a0);
    datatype::~datatype((datatype *)
                        &counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
  }
  else {
    impl::allgatherv_big<int>(data,size,out,recv_sizes,comm);
  }
  datatype::~datatype((datatype *)local_60);
  return;
}

Assistant:

void allgatherv(const T* data, size_t size, T* out, const std::vector<size_t>& recv_sizes, const mxx::comm& comm = mxx::comm()) {
    size_t total_size = std::accumulate(recv_sizes.begin(), recv_sizes.end(), 0);
    MXX_ASSERT(recv_sizes.size() == static_cast<size_t>(comm.size()));
    mxx::datatype mpi_sizet = mxx::get_datatype<size_t>();
    if (total_size >= mxx::max_int) {
        // use custom implementation for large sizes
        impl::allgatherv_big(data, size, out, recv_sizes, comm);
    } else {
        // use standard MPI_Gatherv
        mxx::datatype dt = mxx::get_datatype<T>();
        std::vector<int> counts(comm.size());
        std::copy(recv_sizes.begin(), recv_sizes.end(), counts.begin());
        std::vector<int> displs = impl::get_displacements(counts);
        MPI_Allgatherv(const_cast<T*>(data), size, dt.type(),
                    out, &counts[0], &displs[0], dt.type(), comm);
    }
}